

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

pair<llvm::StringRef,_llvm::StringRef> * __thiscall
llvm::StringRef::split
          (pair<llvm::StringRef,_llvm::StringRef> *__return_storage_ptr__,StringRef *this,
          StringRef Separator)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar3 = find(this,Separator,0);
  if (sVar3 == 0xffffffffffffffff) {
    (__return_storage_ptr__->second).Data = (char *)0x0;
    (__return_storage_ptr__->second).Length = 0;
    sVar3 = this->Length;
    (__return_storage_ptr__->first).Data = this->Data;
    (__return_storage_ptr__->first).Length = sVar3;
  }
  else {
    uVar1 = this->Length;
    sVar4 = sVar3;
    if (uVar1 < sVar3) {
      sVar4 = uVar1;
    }
    uVar5 = Separator.Length + sVar3;
    if (uVar1 < uVar5) {
      uVar5 = uVar1;
    }
    pcVar2 = this->Data;
    (__return_storage_ptr__->first).Data = pcVar2;
    (__return_storage_ptr__->first).Length = sVar4;
    (__return_storage_ptr__->second).Data = pcVar2 + uVar5;
    (__return_storage_ptr__->second).Length = uVar1 - uVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

LLVM_NODISCARD
    std::pair<StringRef, StringRef> split(StringRef Separator) const {
      size_t Idx = find(Separator);
      if (Idx == npos)
        return std::make_pair(*this, StringRef());
      return std::make_pair(slice(0, Idx), slice(Idx + Separator.size(), npos));
    }